

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Output.cpp
# Opt level: O2

void __thiscall Test::Assertion::Assertion(Assertion *this,char *fileName,uint32_t lineNum)

{
  allocator<char> local_36;
  allocator<char> local_35;
  allocator<char> local_34;
  allocator<char> local_33;
  allocator<char> local_32;
  allocator<char> local_31;
  
  std::__cxx11::string::string((string *)this,"",&local_31);
  std::__cxx11::string::string((string *)&this->file,fileName,&local_32);
  std::__cxx11::string::string((string *)&this->method,"",&local_33);
  std::__cxx11::string::string((string *)&this->args,"",&local_34);
  std::__cxx11::string::string((string *)&this->errorMessage,"",&local_35);
  std::__cxx11::string::string((string *)&this->userMessage,"",&local_36);
  this->lineNumber = lineNum;
  return;
}

Assistant:

Assertion::Assertion(const char *fileName, uint32_t lineNum)
    : suite(""), file(fileName), method(""), args(""), errorMessage(""), userMessage(""), lineNumber(lineNum) {}